

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O3

void __thiscall ktx::ValidationContext::validateHeader(ValidationContext *this)

{
  ktx_uint32_t *pkVar1;
  ktx_uint32_t *pkVar2;
  ktx_uint32_t *pkVar3;
  ktx_uint32_t *args_1;
  VkFormat format;
  char cVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  ktx_uint32_t kVar8;
  ktx_uint32_t kVar9;
  char *pcVar10;
  size_t sVar11;
  uint32_t uVar12;
  uint uVar13;
  ktxSupercmpScheme extraout_EDX;
  undefined8 extraout_RDX;
  ktxSupercmpScheme extraout_EDX_00;
  undefined8 extraout_RDX_00;
  ktxSupercmpScheme extraout_EDX_01;
  ktxSupercmpScheme extraout_EDX_02;
  uint uVar14;
  ktxSupercmpScheme kVar15;
  ktxSupercmpScheme extraout_EDX_03;
  ktxSupercmpScheme extraout_EDX_04;
  ktxSupercmpScheme extraout_EDX_05;
  ktxSupercmpScheme extraout_EDX_06;
  char *pcVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  string_view fmt_07;
  string_view fmt_08;
  string_view fmt_09;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  format_args args_09;
  uint max_dim;
  uint32_t fullMipPyramidLevelCount;
  string local_98;
  string local_78;
  ulong local_58 [2];
  uint local_44;
  ktx_uint32_t *local_40;
  ktx_uint32_t *local_38;
  
  pcVar16 = "the header";
  (*this->_vptr_ValidationContext[2])(this,0,&this->header,0x50,10);
  format = (this->header).vkFormat;
  uVar17 = (ulong)format;
  uVar13 = (this->header).supercompressionScheme;
  if (*(int *)((this->header).identifier + 8) != 0xa1a0a0d ||
      *(long *)(this->header).identifier != -0x44cfcddfa7abb455) {
    fatal<>(this,&FileError::NotKTX2);
  }
  cVar4 = isProhibitedFormat(uVar17);
  if (cVar4 == '\0') {
    bVar5 = isValidFormat(format);
    if ((-1 < (int)format & bVar5) == 0) {
      if ((int)format < 0xb9) {
        pcVar10 = (char *)vkFormatString(format);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,pcVar10,(allocator<char> *)local_58);
        iVar7 = std::__cxx11::string::compare((char *)&local_78);
        if (iVar7 == 0) {
          fmt_03.size_ = 2;
          fmt_03.data_ = (char *)0xa;
          args_03.field_1 =
               (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                  )pcVar16;
          args_03.desc_ = (unsigned_long_long)local_58;
          local_58[0] = uVar17;
          ::fmt::v10::vformat_abi_cxx11_(&local_98,(v10 *)0x20aba6,fmt_03,args_03);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_78._M_dataplus._M_p)
              != &local_78.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_78._M_dataplus._M_p._4_4_,
                                     (ktx_uint32_t)local_78._M_dataplus._M_p),
                            local_78.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          local_98._M_dataplus._M_p =
               (pointer)CONCAT44(local_78._M_dataplus._M_p._4_4_,
                                 (ktx_uint32_t)local_78._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p == &local_78.field_2) {
            local_98.field_2._8_8_ = local_78.field_2._8_8_;
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          }
          local_98.field_2._M_allocated_capacity = local_78.field_2._M_allocated_capacity;
          local_98._M_string_length = local_78._M_string_length;
        }
        error<std::__cxx11::string>(this,&HeaderData::InvalidFormat,&local_98);
      }
      else if (format + ~VK_FORMAT_ASTC_12x12_SRGB_BLOCK < 0x3b9acd2f) {
        pcVar10 = (char *)vkFormatString(format);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,pcVar10,(allocator<char> *)local_58);
        iVar7 = std::__cxx11::string::compare((char *)&local_78);
        if (iVar7 == 0) {
          fmt_08.size_ = 2;
          fmt_08.data_ = (char *)0xa;
          args_08.field_1 =
               (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                  )pcVar16;
          args_08.desc_ = (unsigned_long_long)local_58;
          local_58[0] = uVar17;
          ::fmt::v10::vformat_abi_cxx11_(&local_98,(v10 *)0x20aba6,fmt_08,args_08);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_78._M_dataplus._M_p)
              != &local_78.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_78._M_dataplus._M_p._4_4_,
                                     (ktx_uint32_t)local_78._M_dataplus._M_p),
                            local_78.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          local_98._M_dataplus._M_p =
               (pointer)CONCAT44(local_78._M_dataplus._M_p._4_4_,
                                 (ktx_uint32_t)local_78._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p == &local_78.field_2) {
            local_98.field_2._8_8_ = local_78.field_2._8_8_;
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          }
          local_98.field_2._M_allocated_capacity = local_78.field_2._M_allocated_capacity;
          local_98._M_string_length = local_78._M_string_length;
        }
        error<std::__cxx11::string>(this,&HeaderData::InvalidFormat,&local_98);
      }
      else {
        pcVar10 = (char *)vkFormatString(format);
        sVar11 = strlen(pcVar10);
        if ((sVar11 != 0x11) ||
           (auVar18[0] = -(*pcVar10 == 'V'), auVar18[1] = -(pcVar10[1] == 'K'),
           auVar18[2] = -(pcVar10[2] == '_'), auVar18[3] = -(pcVar10[3] == 'U'),
           auVar18[4] = -(pcVar10[4] == 'N'), auVar18[5] = -(pcVar10[5] == 'K'),
           auVar18[6] = -(pcVar10[6] == 'N'), auVar18[7] = -(pcVar10[7] == 'O'),
           auVar18[8] = -(pcVar10[8] == 'W'), auVar18[9] = -(pcVar10[9] == 'N'),
           auVar18[10] = -(pcVar10[10] == '_'), auVar18[0xb] = -(pcVar10[0xb] == 'F'),
           auVar18[0xc] = -(pcVar10[0xc] == 'O'), auVar18[0xd] = -(pcVar10[0xd] == 'R'),
           auVar18[0xe] = -(pcVar10[0xe] == 'M'), auVar18[0xf] = -(pcVar10[0xf] == 'A'),
           auVar19[0] = -(pcVar10[0x10] == 'T'), auVar19[1] = 0xff, auVar19[2] = 0xff,
           auVar19[3] = 0xff, auVar19[4] = 0xff, auVar19[5] = 0xff, auVar19[6] = 0xff,
           auVar19[7] = 0xff, auVar19[8] = 0xff, auVar19[9] = 0xff, auVar19[10] = 0xff,
           auVar19[0xb] = 0xff, auVar19[0xc] = 0xff, auVar19[0xd] = 0xff, auVar19[0xe] = 0xff,
           auVar19[0xf] = 0xff, auVar19 = auVar19 & auVar18,
           (ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                   (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) != 0xffff)) goto LAB_001a75e9;
        pcVar10 = (char *)vkFormatString(format);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,pcVar10,(allocator<char> *)local_58);
        iVar7 = std::__cxx11::string::compare((char *)&local_78);
        if (iVar7 == 0) {
          fmt_09.size_ = 2;
          fmt_09.data_ = (char *)0xa;
          args_09.field_1 =
               (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                  )pcVar16;
          args_09.desc_ = (unsigned_long_long)local_58;
          local_58[0] = uVar17;
          ::fmt::v10::vformat_abi_cxx11_(&local_98,(v10 *)0x20aba6,fmt_09,args_09);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_78._M_dataplus._M_p)
              != &local_78.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_78._M_dataplus._M_p._4_4_,
                                     (ktx_uint32_t)local_78._M_dataplus._M_p),
                            local_78.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          local_98._M_dataplus._M_p =
               (pointer)CONCAT44(local_78._M_dataplus._M_p._4_4_,
                                 (ktx_uint32_t)local_78._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p == &local_78.field_2) {
            local_98.field_2._8_8_ = local_78.field_2._8_8_;
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          }
          local_98.field_2._M_allocated_capacity = local_78.field_2._M_allocated_capacity;
          local_98._M_string_length = local_78._M_string_length;
        }
        warning<std::__cxx11::string>(this,&HeaderData::UnknownFormat,&local_98);
      }
      goto LAB_001a75ce;
    }
  }
  else {
    pcVar10 = (char *)vkFormatString(format);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,pcVar10,(allocator<char> *)local_58);
    iVar7 = std::__cxx11::string::compare((char *)&local_78);
    if (iVar7 == 0) {
      fmt.size_ = 2;
      fmt.data_ = (char *)0xa;
      args.field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                      )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                        )pcVar16;
      args.desc_ = (unsigned_long_long)local_58;
      local_58[0] = uVar17;
      ::fmt::v10::vformat_abi_cxx11_(&local_98,(v10 *)0x20aba6,fmt,args);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_78._M_dataplus._M_p) !=
          &local_78.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_78._M_dataplus._M_p._4_4_,
                                 (ktx_uint32_t)local_78._M_dataplus._M_p),
                        local_78.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_98._M_dataplus._M_p =
           (pointer)CONCAT44(local_78._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_78._M_dataplus._M_p
                            );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p == &local_78.field_2) {
        local_98.field_2._8_8_ = local_78.field_2._8_8_;
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      }
      local_98.field_2._M_allocated_capacity = local_78.field_2._M_allocated_capacity;
      local_98._M_string_length = local_78._M_string_length;
    }
    error<std::__cxx11::string>(this,&HeaderData::ProhibitedFormat,&local_98);
LAB_001a75ce:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
LAB_001a75e9:
  kVar8 = (this->header).vkFormat;
  if (kVar8 != 0 && (this->header).supercompressionScheme == 1) {
    pcVar10 = (char *)vkFormatString(format);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,pcVar10,(allocator<char> *)local_58);
    iVar7 = std::__cxx11::string::compare((char *)&local_78);
    if (iVar7 == 0) {
      fmt_00.size_ = 2;
      fmt_00.data_ = (char *)0xa;
      args_00.field_1 =
           (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
            )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
              )pcVar16;
      args_00.desc_ = (unsigned_long_long)local_58;
      local_58[0] = uVar17;
      ::fmt::v10::vformat_abi_cxx11_(&local_98,(v10 *)0x20aba6,fmt_00,args_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_78._M_dataplus._M_p) !=
          &local_78.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_78._M_dataplus._M_p._4_4_,
                                 (ktx_uint32_t)local_78._M_dataplus._M_p),
                        local_78.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_98._M_dataplus._M_p =
           (pointer)CONCAT44(local_78._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_78._M_dataplus._M_p
                            );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p == &local_78.field_2) {
        local_98.field_2._8_8_ = local_78.field_2._8_8_;
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      }
      local_98.field_2._M_allocated_capacity = local_78.field_2._M_allocated_capacity;
      local_98._M_string_length = local_78._M_string_length;
    }
    error<std::__cxx11::string>(this,&HeaderData::VkFormatAndBasis,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    kVar8 = (this->header).vkFormat;
  }
  if (kVar8 == 0) {
    if ((this->header).typeSize != 1) {
      pcVar10 = (char *)vkFormatString(format);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,pcVar10,(allocator<char> *)local_58);
      iVar7 = std::__cxx11::string::compare((char *)&local_78);
      if (iVar7 == 0) {
        fmt_01.size_ = 2;
        fmt_01.data_ = (char *)0xa;
        args_01.field_1 =
             (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
              )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                )pcVar16;
        args_01.desc_ = (unsigned_long_long)local_58;
        local_58[0] = uVar17;
        ::fmt::v10::vformat_abi_cxx11_(&local_98,(v10 *)0x20aba6,fmt_01,args_01);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_78._M_dataplus._M_p) !=
            &local_78.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_78._M_dataplus._M_p._4_4_,
                                   (ktx_uint32_t)local_78._M_dataplus._M_p),
                          local_78.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        local_98._M_dataplus._M_p =
             (pointer)CONCAT44(local_78._M_dataplus._M_p._4_4_,
                               (ktx_uint32_t)local_78._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p == &local_78.field_2) {
          local_98.field_2._8_8_ = local_78.field_2._8_8_;
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        }
        local_98.field_2._M_allocated_capacity = local_78.field_2._M_allocated_capacity;
        local_98._M_string_length = local_78._M_string_length;
      }
      error<unsigned_int&,std::__cxx11::string>
                (this,&HeaderData::TypeSizeNotOne,&(this->header).typeSize,&local_98);
      goto LAB_001a798c;
    }
  }
  else {
    bVar6 = isFormatBlockCompressed(format);
    if ((bVar6) && ((this->header).typeSize != 1)) {
      pcVar10 = (char *)vkFormatString(format);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,pcVar10,(allocator<char> *)local_58);
      iVar7 = std::__cxx11::string::compare((char *)&local_78);
      if (iVar7 == 0) {
        fmt_02.size_ = 2;
        fmt_02.data_ = (char *)0xa;
        args_02.field_1 =
             (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
              )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                )pcVar16;
        args_02.desc_ = (unsigned_long_long)local_58;
        local_58[0] = uVar17;
        ::fmt::v10::vformat_abi_cxx11_(&local_98,(v10 *)0x20aba6,fmt_02,args_02);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_78._M_dataplus._M_p) !=
            &local_78.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_78._M_dataplus._M_p._4_4_,
                                   (ktx_uint32_t)local_78._M_dataplus._M_p),
                          local_78.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        local_98._M_dataplus._M_p =
             (pointer)CONCAT44(local_78._M_dataplus._M_p._4_4_,
                               (ktx_uint32_t)local_78._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p == &local_78.field_2) {
          local_98.field_2._8_8_ = local_78.field_2._8_8_;
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        }
        local_98.field_2._M_allocated_capacity = local_78.field_2._M_allocated_capacity;
        local_98._M_string_length = local_78._M_string_length;
      }
      error<unsigned_int&,std::__cxx11::string>
                (this,&HeaderData::TypeSizeNotOne,&(this->header).typeSize,&local_98);
LAB_001a798c:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if ((this->header).pixelWidth == 0) {
    error<>(this,&HeaderData::WidthZero);
  }
  bVar6 = isFormatBlockCompressed(format);
  pkVar1 = &(this->header).pixelHeight;
  kVar8 = (this->header).pixelHeight;
  kVar15 = (ktxSupercmpScheme)CONCAT71((int7)((ulong)extraout_RDX >> 8),kVar8 == 0 && bVar6);
  if (kVar8 == 0 && bVar6) {
    pcVar10 = (char *)vkFormatString(format);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,pcVar10,(allocator<char> *)local_58);
    iVar7 = std::__cxx11::string::compare((char *)&local_78);
    if (iVar7 == 0) {
      fmt_04.size_ = 2;
      fmt_04.data_ = (char *)0xa;
      args_04.field_1 =
           (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
            )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
              )pcVar16;
      args_04.desc_ = (unsigned_long_long)local_58;
      local_58[0] = uVar17;
      ::fmt::v10::vformat_abi_cxx11_(&local_98,(v10 *)0x20aba6,fmt_04,args_04);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_78._M_dataplus._M_p) !=
          &local_78.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_78._M_dataplus._M_p._4_4_,
                                 (ktx_uint32_t)local_78._M_dataplus._M_p),
                        local_78.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_98._M_dataplus._M_p =
           (pointer)CONCAT44(local_78._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_78._M_dataplus._M_p
                            );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p == &local_78.field_2) {
        local_98.field_2._8_8_ = local_78.field_2._8_8_;
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      }
      local_98.field_2._M_allocated_capacity = local_78.field_2._M_allocated_capacity;
      local_98._M_string_length = local_78._M_string_length;
    }
    error<std::__cxx11::string>(this,&HeaderData::BlockCompressedNoHeight,&local_98);
    kVar15 = extraout_EDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      kVar15 = extraout_EDX_00;
    }
    kVar8 = *pkVar1;
  }
  if ((uVar13 ^ 1) == 0 && kVar8 == 0) {
    toString_abi_cxx11_(&local_78,(ktx *)0x1,kVar15);
    error<std::__cxx11::string>(this,&HeaderData::BlockCompressedNoHeight,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_78._M_dataplus._M_p) !=
        &local_78.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_78._M_dataplus._M_p._4_4_,
                               (ktx_uint32_t)local_78._M_dataplus._M_p),
                      local_78.field_2._M_allocated_capacity + 1);
    }
    kVar8 = *pkVar1;
  }
  pkVar2 = &(this->header).pixelWidth;
  if (((this->header).faceCount == 6) && ((this->header).pixelWidth != kVar8)) {
    error<unsigned_int&,unsigned_int&>(this,&HeaderData::CubeHeightWidthMismatch,pkVar2,pkVar1);
    kVar8 = (this->header).pixelHeight;
  }
  pkVar3 = &(this->header).pixelDepth;
  kVar9 = (this->header).pixelDepth;
  local_38 = pkVar1;
  if ((kVar9 != 0) && (kVar8 == 0)) {
    error<unsigned_int&>(this,&HeaderData::DepthNoHeight,pkVar3);
    kVar9 = (this->header).pixelDepth;
  }
  if ((format + 0xc460d100 < 0x1e) && (kVar9 == 0)) {
    pcVar10 = (char *)vkFormatString(format);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,pcVar10,(allocator<char> *)local_58);
    iVar7 = std::__cxx11::string::compare((char *)&local_78);
    if (iVar7 == 0) {
      fmt_05.size_ = 2;
      fmt_05.data_ = (char *)0xa;
      args_05.field_1 =
           (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
            )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
              )pcVar16;
      args_05.desc_ = (unsigned_long_long)local_58;
      local_58[0] = uVar17;
      ::fmt::v10::vformat_abi_cxx11_(&local_98,(v10 *)0x20aba6,fmt_05,args_05);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_78._M_dataplus._M_p) !=
          &local_78.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_78._M_dataplus._M_p._4_4_,
                                 (ktx_uint32_t)local_78._M_dataplus._M_p),
                        local_78.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_98._M_dataplus._M_p =
           (pointer)CONCAT44(local_78._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_78._M_dataplus._M_p
                            );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p == &local_78.field_2) {
        local_98.field_2._8_8_ = local_78.field_2._8_8_;
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      }
      local_98.field_2._M_allocated_capacity = local_78.field_2._M_allocated_capacity;
      local_98._M_string_length = local_78._M_string_length;
    }
    error<std::__cxx11::string>(this,&HeaderData::DepthBlockCompressedNoDepth,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  pkVar1 = &(this->header).faceCount;
  local_44 = uVar13;
  if ((format - VK_FORMAT_D16_UNORM < 7) && (format - VK_FORMAT_D16_UNORM != 3)) {
    if (*pkVar3 != 0) {
LAB_001a7c67:
      pcVar10 = (char *)vkFormatString(format);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,pcVar10,(allocator<char> *)local_58);
      iVar7 = std::__cxx11::string::compare((char *)&local_78);
      if (iVar7 == 0) {
        fmt_06.size_ = 2;
        fmt_06.data_ = (char *)0xa;
        args_06.field_1 =
             (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
              )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                )pcVar16;
        args_06.desc_ = (unsigned_long_long)local_58;
        local_58[0] = uVar17;
        ::fmt::v10::vformat_abi_cxx11_(&local_98,(v10 *)0x20aba6,fmt_06,args_06);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_78._M_dataplus._M_p) !=
            &local_78.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_78._M_dataplus._M_p._4_4_,
                                   (ktx_uint32_t)local_78._M_dataplus._M_p),
                          local_78.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        local_98._M_dataplus._M_p =
             (pointer)CONCAT44(local_78._M_dataplus._M_p._4_4_,
                               (ktx_uint32_t)local_78._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p == &local_78.field_2) {
          local_98.field_2._8_8_ = local_78.field_2._8_8_;
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        }
        local_98.field_2._M_allocated_capacity = local_78.field_2._M_allocated_capacity;
        local_98._M_string_length = local_78._M_string_length;
      }
      error<unsigned_int&,std::__cxx11::string>
                (this,&HeaderData::DepthStencilFormatWithDepth,pkVar3,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      kVar8 = *pkVar3;
      goto LAB_001a7d61;
    }
LAB_001a7dab:
    if ((this->header).pixelHeight == 0) {
      this->dimensionCount = 1;
    }
    else {
      this->dimensionCount = 2;
    }
  }
  else {
    kVar8 = *pkVar3;
    if (kVar8 != 0 && 0xfffffffb < format - VK_FORMAT_BC1_RGB_UNORM_BLOCK) goto LAB_001a7c67;
LAB_001a7d61:
    if (kVar8 != 0 && *pkVar1 == 6) {
      error<unsigned_int&>(this,&HeaderData::CubeWithDepth,pkVar3);
      kVar8 = (this->header).pixelDepth;
    }
    if (kVar8 == 0) goto LAB_001a7dab;
    this->dimensionCount = 3;
    if ((this->header).layerCount != 0) {
      warning<>(this,&HeaderData::ThreeDArray);
    }
  }
  kVar8 = (this->header).layerCount;
  kVar9 = (this->header).faceCount;
  this->numLayers = kVar8 + (kVar8 == 0);
  local_40 = pkVar2;
  if ((kVar9 != 1) && (kVar9 != 6)) {
    error<unsigned_int&>(this,&HeaderData::InvalidFaceCount,pkVar1);
  }
  bVar6 = isFormatBlockCompressed(format);
  pkVar2 = &(this->header).levelCount;
  kVar8 = (this->header).levelCount;
  kVar15 = (ktxSupercmpScheme)CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),kVar8 == 0 && bVar6);
  if (kVar8 == 0 && bVar6) {
    pcVar10 = (char *)vkFormatString(format);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,pcVar10,(allocator<char> *)local_58);
    iVar7 = std::__cxx11::string::compare((char *)&local_78);
    if (iVar7 == 0) {
      fmt_07.size_ = 2;
      fmt_07.data_ = (char *)0xa;
      args_07.field_1 =
           (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
            )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
              )pcVar16;
      args_07.desc_ = (unsigned_long_long)local_58;
      local_58[0] = uVar17;
      ::fmt::v10::vformat_abi_cxx11_(&local_98,(v10 *)0x20aba6,fmt_07,args_07);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_78._M_dataplus._M_p) !=
          &local_78.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_78._M_dataplus._M_p._4_4_,
                                 (ktx_uint32_t)local_78._M_dataplus._M_p),
                        local_78.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_98._M_dataplus._M_p =
           (pointer)CONCAT44(local_78._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_78._M_dataplus._M_p
                            );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p == &local_78.field_2) {
        local_98.field_2._8_8_ = local_78.field_2._8_8_;
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      }
      local_98.field_2._M_allocated_capacity = local_78.field_2._M_allocated_capacity;
      local_98._M_string_length = local_78._M_string_length;
    }
    error<std::__cxx11::string>(this,&HeaderData::BlockCompressedNoLevel,&local_98);
    kVar15 = extraout_EDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      kVar15 = extraout_EDX_02;
    }
    kVar8 = *pkVar2;
  }
  if ((uVar13 ^ 1) == 0 && kVar8 == 0) {
    toString_abi_cxx11_(&local_78,(ktx *)0x1,kVar15);
    error<std::__cxx11::string>(this,&HeaderData::BlockCompressedNoLevel,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_78._M_dataplus._M_p) !=
        &local_78.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_78._M_dataplus._M_p._4_4_,
                               (ktx_uint32_t)local_78._M_dataplus._M_p),
                      local_78.field_2._M_allocated_capacity + 1);
    }
    kVar8 = *pkVar2;
  }
  uVar12 = kVar8 + (kVar8 == 0);
  this->numLevels = uVar12;
  uVar13 = (this->header).pixelWidth;
  uVar14 = (this->header).pixelHeight;
  if (uVar14 < uVar13) {
    uVar14 = uVar13;
  }
  uVar13 = (this->header).pixelDepth;
  if (uVar14 <= uVar13) {
    uVar14 = uVar13;
  }
  local_98._M_dataplus._M_p._0_4_ = uVar14;
  kVar15 = uVar14 >> ((char)uVar12 - 1U & 0x1f);
  if (kVar15 == KTX_SS_BEGIN_RANGE) {
    error<unsigned_int&,unsigned_int_const&>
              (this,&HeaderData::TooManyMipLevels,&this->numLevels,(uint *)&local_98);
    kVar15 = extraout_EDX_03;
  }
  uVar13 = (this->header).supercompressionScheme;
  if ((uVar13 & 0xffff0000) == 0x10000) {
    toString_abi_cxx11_(&local_78,(ktx *)(ulong)local_44,kVar15);
    warning<std::__cxx11::string>(this,&HeaderData::VendorSupercompression,&local_78);
    kVar15 = extraout_EDX_04;
  }
  else {
    if (uVar13 < 4) goto LAB_001a7ff6;
    toString_abi_cxx11_(&local_78,(ktx *)(ulong)local_44,kVar15);
    error<std::__cxx11::string>(this,&HeaderData::InvalidSupercompression,&local_78);
    kVar15 = extraout_EDX_05;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_78._M_dataplus._M_p) !=
      &local_78.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_78._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_78._M_dataplus._M_p
                            ),local_78.field_2._M_allocated_capacity + 1);
    kVar15 = extraout_EDX_06;
  }
LAB_001a7ff6:
  if (this->checkGLTFBasisU == true) {
    if (2 < (this->header).supercompressionScheme) {
      toString_abi_cxx11_(&local_78,(ktx *)(ulong)local_44,kVar15);
      error<std::__cxx11::string>(this,&HeaderData::InvalidSupercompressionGLTFBU,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_78._M_dataplus._M_p._4_4_,(ktx_uint32_t)local_78._M_dataplus._M_p) !=
          &local_78.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_78._M_dataplus._M_p._4_4_,
                                 (ktx_uint32_t)local_78._M_dataplus._M_p),
                        local_78.field_2._M_allocated_capacity + 1);
      }
    }
    args_1 = &(this->header).layerCount;
    if (*pkVar3 != 0) {
      local_78._M_dataplus._M_p._0_4_ = 0;
      error<char_const(&)[11],unsigned_int&,int>
                (this,&HeaderData::InvalidTextureTypeGLTFBU,(char (*) [11])0x1fbfe7,pkVar3,
                 (int *)&local_78);
    }
    if (*args_1 != 0) {
      local_78._M_dataplus._M_p._0_4_ = 0;
      error<char_const(&)[11],unsigned_int&,int>
                (this,&HeaderData::InvalidTextureTypeGLTFBU,(char (*) [11])0x1fbffa,args_1,
                 (int *)&local_78);
    }
    pkVar3 = local_38;
    if (*pkVar1 != 1) {
      local_78._M_dataplus._M_p._0_4_ = 1;
      error<char_const(&)[10],unsigned_int&,int>
                (this,&HeaderData::InvalidTextureTypeGLTFBU,(char (*) [10])0x1fc00d,pkVar1,
                 (int *)&local_78);
    }
    if ((*local_40 & 3) != 0) {
      error<char_const(&)[11],unsigned_int&>
                (this,&HeaderData::InvalidPixelWidthHeightGLTFBU,(char (*) [11])0x1fbfc0,local_40);
    }
    if ((*pkVar3 & 3) != 0) {
      error<char_const(&)[12],unsigned_int&>
                (this,&HeaderData::InvalidPixelWidthHeightGLTFBU,(char (*) [12])0x1fbfd3,pkVar3);
    }
    uVar13 = (uint)local_98._M_dataplus._M_p >> 1 | (uint)local_98._M_dataplus._M_p;
    uVar13 = uVar13 >> 2 | uVar13;
    uVar13 = uVar13 >> 4 | uVar13;
    uVar13 = uVar13 >> 8 | uVar13;
    uVar13 = uVar13 >> 0x10 | uVar13;
    uVar13 = ~(uVar13 >> 1) & uVar13;
    local_78._M_dataplus._M_p._0_4_ =
         ((uint)(0xffff < uVar13) << 4 | (uint)((uVar13 & 0xaaaaaaaa) != 0)) +
         (uint)((uVar13 & 0xcccccccc) != 0) * 2 + (uint)((uVar13 & 0xf0f0f0f0) != 0) * 4 +
         (uint)((uVar13 & 0xff00ff00) != 0) * 8 + 1;
    if ((*pkVar2 != 1) && (*pkVar2 != (ktx_uint32_t)local_78._M_dataplus._M_p)) {
      error<unsigned_int&,unsigned_int&>
                (this,&HeaderData::InvalidLevelCountGLTFBU,pkVar2,(uint *)&local_78);
    }
  }
  return;
}

Assistant:

void ValidationContext::validateHeader() {
    static constexpr uint8_t ktx2_identifier_reference[12] = KTX2_IDENTIFIER_REF;

    read(0, &header, sizeof(KTX_header2), "the header");
    const auto vkFormat = VkFormat(header.vkFormat);
    const auto supercompressionScheme = ktxSupercmpScheme(header.supercompressionScheme);

    // Validate file identifier
    if (std::memcmp(&header.identifier, ktx2_identifier_reference, 12) != 0)
        fatal(FileError::NotKTX2);

    // Validate vkFormat
    if (isProhibitedFormat(vkFormat)) {
        error(HeaderData::ProhibitedFormat, toString(vkFormat));

    } else if (!isFormatValid(vkFormat)) {
        if (vkFormat <= VK_FORMAT_MAX_STANDARD_ENUM)
            error(HeaderData::InvalidFormat, toString(vkFormat));
        if (VK_FORMAT_MAX_STANDARD_ENUM < vkFormat && vkFormat < 1000001000)
            error(HeaderData::InvalidFormat, toString(vkFormat));
        if (1000001000 <= vkFormat && !isFormatKnown(vkFormat))
            warning(HeaderData::UnknownFormat, toString(vkFormat));
    }

    if (header.supercompressionScheme == KTX_SS_BASIS_LZ) {
        if (header.vkFormat != VK_FORMAT_UNDEFINED)
            error(HeaderData::VkFormatAndBasis, toString(vkFormat));
    }

    // Validate typeSize
    if (header.vkFormat == VK_FORMAT_UNDEFINED) {
        if (header.typeSize != 1)
            error(HeaderData::TypeSizeNotOne, header.typeSize, toString(vkFormat));

    } else if (isFormatBlockCompressed(vkFormat)) {
        if (header.typeSize != 1)
            error(HeaderData::TypeSizeNotOne, header.typeSize, toString(vkFormat));
    }
    // Additional checks are performed on typeSize after the DFD is parsed

    // Validate image dimensions
    if (header.pixelWidth == 0)
        error(HeaderData::WidthZero);

    if (isFormatBlockCompressed(vkFormat))
        if (header.pixelHeight == 0)
            error(HeaderData::BlockCompressedNoHeight, toString(vkFormat));
    if (isSupercompressionBlockCompressed(supercompressionScheme))
        if (header.pixelHeight == 0)
            error(HeaderData::BlockCompressedNoHeight, toString(supercompressionScheme));
    // Additional block-compressed formats (like UASTC) are detected after the DFD is parsed to validate pixelHeight

    if (header.faceCount == 6)
        if (header.pixelWidth != header.pixelHeight)
            error(HeaderData::CubeHeightWidthMismatch, header.pixelWidth, header.pixelHeight);

    if (header.pixelDepth != 0 && header.pixelHeight == 0)
        error(HeaderData::DepthNoHeight, header.pixelDepth);

    if (isFormat3DBlockCompressed(vkFormat))
        if (header.pixelDepth == 0)
            error(HeaderData::DepthBlockCompressedNoDepth, toString(vkFormat));

    if (isFormatDepth(vkFormat) || isFormatStencil(vkFormat))
        if (header.pixelDepth != 0)
            error(HeaderData::DepthStencilFormatWithDepth, header.pixelDepth, toString(vkFormat));

    if (header.faceCount == 6)
        if (header.pixelDepth != 0)
            error(HeaderData::CubeWithDepth, header.pixelDepth);

    // Detect dimension counts
    if (header.pixelDepth != 0) {
        dimensionCount = 3;
        if (header.layerCount != 0)
            warning(HeaderData::ThreeDArray); // Warning on 3D Array textures
    } else if (header.pixelHeight != 0) {
        dimensionCount = 2;
    } else {
        dimensionCount = 1;
    }

    // Validate layerCount to actual number of layers.
    numLayers = std::max(header.layerCount, 1u);

    // Validate faceCount
    if (header.faceCount != 6 && header.faceCount != 1)
        error(HeaderData::InvalidFaceCount, header.faceCount);

    // 2D Cube map faces were validated by CubeHeightWidthMismatch and CubeWithDepth

    // Validate levelCount
    if (isFormatBlockCompressed(vkFormat))
        if (header.levelCount == 0)
            error(HeaderData::BlockCompressedNoLevel, toString(vkFormat));
    if (isSupercompressionBlockCompressed(supercompressionScheme))
        if (header.levelCount == 0)
            error(HeaderData::BlockCompressedNoLevel, toString(supercompressionScheme));
    // Additional block-compressed formats (like UASTC) are detected after the DFD is parsed to validate levelCount

    numLevels = std::max(header.levelCount, 1u);

    // This test works for arrays too because height or depth will be 0.
    const auto max_dim = std::max(std::max(header.pixelWidth, header.pixelHeight), header.pixelDepth);
    if (max_dim < (1u << (numLevels - 1u))) {
        // Can't have more mip levels than 1 + log2(max(width, height, depth))
        error(HeaderData::TooManyMipLevels, numLevels, max_dim);
    }

    // Validate supercompressionScheme
    if (KTX_SS_BEGIN_VENDOR_RANGE <= header.supercompressionScheme && header.supercompressionScheme <= KTX_SS_END_VENDOR_RANGE)
        warning(HeaderData::VendorSupercompression, toString(supercompressionScheme));
    else if (header.supercompressionScheme < KTX_SS_BEGIN_RANGE || KTX_SS_END_RANGE < header.supercompressionScheme)
        error(HeaderData::InvalidSupercompression, toString(supercompressionScheme));

    // Validate GLTF KHR_texture_basisu compatibility, if needed
    if (checkGLTFBasisU) {
        // Check for allowed supercompression schemes
        switch (header.supercompressionScheme) {
        case KTX_SS_NONE: [[fallthrough]];
        case KTX_SS_BASIS_LZ: [[fallthrough]];
        case KTX_SS_ZSTD:
            break;
        default:
            error(HeaderData::InvalidSupercompressionGLTFBU, toString(supercompressionScheme));
            break;
        }

        // Check that texture type is 2D
        // NOTE: pixelHeight == 0 already covered by other error codes
        if (header.pixelDepth != 0)
            error(HeaderData::InvalidTextureTypeGLTFBU, "pixelDepth", header.pixelDepth, 0);
        if (header.layerCount != 0)
            error(HeaderData::InvalidTextureTypeGLTFBU, "layerCount", header.layerCount, 0);
        if (header.faceCount != 1)
            error(HeaderData::InvalidTextureTypeGLTFBU, "faceCount", header.faceCount, 1);

        // Check that width and height are multiples of 4
        if (header.pixelWidth % 4 != 0)
            error(HeaderData::InvalidPixelWidthHeightGLTFBU, "pixelWidth", header.pixelWidth);
        if (header.pixelHeight % 4 != 0)
            error(HeaderData::InvalidPixelWidthHeightGLTFBU, "pixelHeight", header.pixelHeight);

        // Check that levelCount is 1 or that the full mip pyramid is present
        uint32_t fullMipPyramidLevelCount = 1 + (uint32_t)log2(max_dim);
        if (header.levelCount != 1 && header.levelCount != fullMipPyramidLevelCount)
            error(HeaderData::InvalidLevelCountGLTFBU, header.levelCount, fullMipPyramidLevelCount);
    }
}